

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclDnsize.c
# Opt level: O3

int Abc_SclCheckOverlap(Abc_Ntk_t *pNtk,Vec_Int_t *vNodes)

{
  int iVar1;
  void **ppvVar2;
  long *plVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  
  iVar5 = vNodes->nSize;
  if (0 < iVar5) {
    lVar6 = 0;
    do {
      iVar1 = vNodes->pArray[lVar6];
      if (((long)iVar1 < 0) || (pNtk->vObjs->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      ppvVar2 = pNtk->vObjs->pArray;
      plVar3 = (long *)ppvVar2[iVar1];
      if (plVar3 != (long *)0x0) {
        lVar4 = *plVar3;
        iVar5 = (int)plVar3[2];
        Vec_IntFillExtra((Vec_Int_t *)(lVar4 + 0xe0),iVar5 + 1,(int)ppvVar2);
        if (((long)iVar5 < 0) || (*(int *)(lVar4 + 0xe4) <= iVar5)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (*(int *)(*(long *)(lVar4 + 0xe8) + (long)iVar5 * 4) == *(int *)(*plVar3 + 0xd8)) {
          return 1;
        }
        iVar5 = vNodes->nSize;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar5);
  }
  return 0;
}

Assistant:

int Abc_SclCheckOverlap( Abc_Ntk_t * pNtk, Vec_Int_t * vNodes )
{
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkForEachObjVec( vNodes, pNtk, pObj, i )
        if ( Abc_NodeIsTravIdCurrent(pObj) )
            return 1;
    return 0;
}